

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferBlockReferencedByShaderSingleBlockContentCases<(glu::Storage)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               int expandLevel)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  ResourceTestCase *pRVar4;
  deInt32 *pdVar5;
  SharedPtr dummyVariable;
  SharedPtr block;
  SharedPtr dummyVariable_2;
  SharedPtr storage;
  SharedPtr defaultBlock;
  SharedPtr local_98;
  Node *local_88;
  SharedPtrStateBase *pSStack_80;
  SharedPtr local_78;
  Node *local_68;
  SharedPtrStateBase *pSStack_60;
  Node *local_58;
  SharedPtrStateBase *pSStack_50;
  TestNode *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  local_40 = &targetGroup->super_TestNode;
  pNVar1 = (Node *)operator_new(0x20);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar1->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52810;
  pSStack_50 = (SharedPtrStateBase *)0x0;
  local_58 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  pSStack_50 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52848;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  pSStack_60 = (SharedPtrStateBase *)0x0;
  local_68 = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  pSStack_60 = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar1->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar1[1]._vptr_Node = 1;
  pSStack_80 = (SharedPtrStateBase *)0x0;
  local_88 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  pSStack_80 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0x25;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400
            );
  ResourceTestCase::ResourceTestCase
            (pRVar4,context,&local_98,(ProgramResourceQueryTestTarget *)&local_78,"named_block");
  tcu::TestNode::addChild(local_40,(TestNode *)pRVar4);
  pdVar5 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    local_98.m_ptr = (Node *)0x0;
    (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(local_98.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_98.m_state = (SharedPtrStateBase *)0x0;
  }
  if (pSStack_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &pSStack_80->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_88 = (Node *)0x0;
      (*pSStack_80->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &pSStack_80->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_80 = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar1->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = local_68;
  (pNVar1->m_enclosingNode).m_state = pSStack_60;
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_60->strongRefCount = pSStack_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar1[1]._vptr_Node = 0;
  pSStack_80 = (SharedPtrStateBase *)0x0;
  local_88 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  pSStack_80 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0x25;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400
            );
  ResourceTestCase::ResourceTestCase
            (pRVar4,context,&local_98,(ProgramResourceQueryTestTarget *)&local_78,"unnamed_block");
  tcu::TestNode::addChild(local_40,(TestNode *)pRVar4);
  pdVar5 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    local_98.m_ptr = (Node *)0x0;
    (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(local_98.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_98.m_state = (SharedPtrStateBase *)0x0;
  }
  if (pSStack_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &pSStack_80->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_88 = (Node *)0x0;
      (*pSStack_80->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &pSStack_80->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_80 = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar1->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar1->m_enclosingNode).m_ptr = local_68;
  (pNVar1->m_enclosingNode).m_state = pSStack_60;
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_60->strongRefCount = pSStack_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 3;
  pSStack_80 = (SharedPtrStateBase *)0x0;
  local_88 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  pSStack_80 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 1;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 0x25;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78.m_state = pSVar2;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_SHADER_STORAGE_BLOCK,0x400);
  ResourceTestCase::ResourceTestCase(pRVar4,context,&local_78,&local_38,"block_array");
  tcu::TestNode::addChild(local_40,(TestNode *)pRVar4);
  pdVar5 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(local_78.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_78.m_state = (SharedPtrStateBase *)0x0;
  }
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(local_98.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &(local_98.m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_98.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &pSStack_80->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_88 = (Node *)0x0;
      (*pSStack_80->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &pSStack_80->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_80 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &pSStack_60->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_68 = (Node *)0x0;
      (*pSStack_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &pSStack_60->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (pSStack_60 != (SharedPtrStateBase *)0x0) {
        (*pSStack_60->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_60 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &pSStack_50->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_58 = (Node *)0x0;
      (*pSStack_50->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &pSStack_50->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if ((*pdVar5 == 0) && (pSStack_50 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_50->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferBlockReferencedByShaderSingleBlockContentCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, int expandLevel)
{
	const ProgramInterface						programInterface	= (Storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
																      (Storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
																      (PROGRAMINTERFACE_LAST);
	const ResourceDefinition::Node::SharedPtr	defaultBlock		(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	storage				(new ResourceDefinition::StorageQualifier(defaultBlock, Storage));

	DE_UNREF(expandLevel);

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	// .named_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(storage, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "named_block"));
	}

	// .unnamed_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(storage, false));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "unnamed_block"));
	}

	// .block_array
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(storage, 3));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		targetGroup->addChild(new ResourceTestCase(context, dummyVariable, ProgramResourceQueryTestTarget(programInterface, PROGRAMRESOURCEPROP_REFERENCED_BY_SHADER), "block_array"));
	}
}